

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock.c
# Opt level: O3

_Bool nonblock(int fd)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  ulong unaff_RBP;
  ulong uVar4;
  stat sStack_c0;
  ulong uStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x13f4d5;
  uVar1 = fcntl(fd,3);
  if ((int)uVar1 < 0) {
    pcStack_20 = (code *)0x13f50b;
    nonblock_cold_2();
  }
  else {
    unaff_RBP = (ulong)uVar1;
    pcStack_20 = (code *)0x13f4f1;
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    if (-1 < iVar2) {
      return (_Bool)((byte)(uVar1 >> 0xb) & 1);
    }
  }
  pcStack_20 = no_nonblock;
  uVar4 = (ulong)(uint)fd;
  nonblock_cold_1();
  puVar3 = (undefined8 *)(uVar4 & 0xffffffff);
  sStack_c0.__unused[2] = 0x13f523;
  uStack_28 = (ulong)(uint)fd;
  pcStack_20 = (code *)unaff_RBP;
  uVar1 = fcntl((int)uVar4,3);
  if ((int)uVar1 < 0) {
    sStack_c0.__unused[2] = 0x13f559;
    no_nonblock_cold_2();
  }
  else {
    sStack_c0.__unused[2] = 0x13f53f;
    iVar2 = fcntl((int)uVar4,4,(ulong)(uVar1 & 0x7ffff7ff));
    if (-1 < iVar2) {
      return (_Bool)((byte)(uVar1 >> 0xb) & 1);
    }
  }
  sStack_c0.__unused[2] = (long)open_for_write_would_lose_data;
  no_nonblock_cold_1();
  iVar2 = stat((char *)*puVar3,&sStack_c0);
  return -1 < iVar2 && (0 < sStack_c0.st_size && (sStack_c0.st_mode & 0xf000) == 0x8000);
}

Assistant:

bool nonblock(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFL);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFL): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFL, fdflags | O_NONBLOCK) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFL): %s\n", fd, strerror(errno));
        exit(1);
    }

    return fdflags & O_NONBLOCK;
}